

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

Entry * __thiscall
Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::
lockEntriesAndGrowIfNeeded
          (PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *this,
          size_t *newMemUsed)

{
  pointer *pppEVar1;
  iterator __position;
  uint uVar2;
  ulong *puVar3;
  size_t sVar4;
  ulong uVar5;
  Entry *pEVar6;
  ulong uVar7;
  Entry *pEVar8;
  uint32_t uVar9;
  size_t sVar10;
  bool bVar11;
  Entry *pEStack_28;
  
  do {
    do {
      pEStack_28 = this->_entries;
    } while (pEStack_28 == (Entry *)0x0);
    LOCK();
    bVar11 = pEStack_28 == this->_entries;
    if (bVar11) {
      this->_entries = (Entry *)0x0;
    }
    UNLOCK();
  } while (!bVar11);
  if (this->_numEntries <= this->_size * 2) {
    __position._M_current =
         (this->_oldEntries).
         super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_oldEntries).
        super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,Ptex::v2_4::PtexCachedReader*>::Entry*,std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,Ptex::v2_4::PtexCachedReader*>::Entry*>>
      ::
      _M_realloc_insert<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,Ptex::v2_4::PtexCachedReader*>::Entry*const&>
                ((vector<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,Ptex::v2_4::PtexCachedReader*>::Entry*,std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,Ptex::v2_4::PtexCachedReader*>::Entry*>>
                  *)&this->_oldEntries,__position,&pEStack_28);
    }
    else {
      *__position._M_current = pEStack_28;
      pppEVar1 = &(this->_oldEntries).
                  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
    }
    uVar2 = this->_numEntries * 2;
    sVar10 = (ulong)uVar2 * 0x20;
    puVar3 = (ulong *)operator_new__(sVar10 + 8);
    *puVar3 = (ulong)uVar2;
    if (uVar2 != 0) {
      sVar4 = 0;
      do {
        *(undefined8 *)((long)puVar3 + sVar4 + 8) = 0;
        *(undefined4 *)((long)puVar3 + sVar4 + 0x10) = 0;
        *(undefined4 *)((long)puVar3 + sVar4 + 0x14) = 0;
        *(undefined1 *)((long)puVar3 + sVar4 + 0x18) = 0;
        *(undefined8 *)((long)puVar3 + sVar4 + 0x20) = 0;
        sVar4 = sVar4 + 0x20;
      } while (sVar10 != sVar4);
    }
    *newMemUsed = sVar10;
    if (this->_numEntries != 0) {
      uVar5 = 0;
      do {
        if (pEStack_28[uVar5].value != (PtexCachedReader *)0x0) {
          pEVar6 = pEStack_28 + uVar5;
          uVar9 = (pEVar6->key)._hash;
          do {
            uVar7 = (ulong)(uVar9 & uVar2 - 1);
            uVar9 = uVar9 + 1;
          } while (puVar3[uVar7 * 4 + 4] != 0);
          pEVar8 = (Entry *)(puVar3 + 1) + uVar7;
          (pEVar8->key)._val = (pEVar6->key)._val;
          (pEVar8->key)._len = (pEVar6->key)._len;
          (pEVar8->key)._hash = (pEVar6->key)._hash;
          (pEVar8->key)._ownsVal = (pEVar6->key)._ownsVal;
          (pEVar6->key)._ownsVal = false;
          pEVar8->value = pEVar6->value;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->_numEntries);
    }
    this->_numEntries = uVar2;
    return (Entry *)(puVar3 + 1);
  }
  return pEStack_28;
}

Assistant:

Entry* lockEntriesAndGrowIfNeeded(size_t& newMemUsed)
    {
        Entry* entries = lockEntries();
        if (_size*2 >= _numEntries) {
            entries = grow(entries, newMemUsed);
        }
        return entries;
    }